

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O3

void __thiscall Centaurus::Grammar<wchar_t>::optimize(Grammar<wchar_t> *this)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->m_networks)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    ATNMachine<wchar_t>::drop_passthrough_nodes((ATNMachine<wchar_t> *)(p_Var1 + 6));
  }
  return;
}

Assistant:

virtual void optimize() override
    {
        for (auto& p : m_networks)
        {
            p.second.drop_passthrough_nodes();
        }
    }